

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::EmitTest::init(EmitTest *this,EVP_PKEY_CTX *ctx)

{
  VertexEmitterShader *this_00;
  GeometryShaderOutputType GVar1;
  int iVar2;
  ShaderProgramDeclaration *pSVar3;
  ostream *poVar4;
  GeometryShaderOutputType outputType;
  int iVar5;
  int iVar6;
  bool bVar7;
  ostringstream str;
  ContextType local_4c8;
  allocator<char> local_4c4;
  allocator<char> local_4c3;
  allocator<char> local_4c2;
  allocator<char> local_4c1;
  int local_4c0;
  int local_4bc;
  VertexEmitterShader *local_4b8;
  ulong local_4b0;
  EmitTest *local_4a8;
  ShaderProgramDeclaration *local_4a0;
  string local_498;
  FragmentOutput local_474;
  string local_470;
  GeometrySource local_450;
  string local_430;
  string local_410;
  FragmentSource local_3f0;
  string local_3d0;
  string local_3b0;
  VertexSource local_390;
  string local_370 [32];
  string local_350 [32];
  GeometryToFragmentVarying local_330;
  VertexToGeometryVarying local_328;
  VertexAttribute local_320;
  VertexAttribute local_2f8;
  GeometryShaderDeclaration local_2d0;
  ostream local_2b8;
  ShaderProgramDeclaration local_140;
  
  local_4b8 = (VertexEmitterShader *)operator_new(0x168);
  local_4a8 = this;
  local_4c8.super_ApiType.m_bits =
       (ApiType)(*((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->m_renderCtx->
                  _vptr_RenderContext[2])();
  iVar2 = local_4a8->m_emitCountA;
  local_4bc = local_4a8->m_endCountA;
  local_4b0 = (ulong)(uint)local_4a8->m_emitCountB;
  local_4c0 = local_4a8->m_endCountB;
  GVar1 = sglr::rr_util::mapGLGeometryShaderOutputType(local_4a8->m_outputType);
  (local_4b8->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_01e4f8b0;
  (local_4b8->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_01e4f8e8;
  (local_4b8->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_01e4f900;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_140);
  std::__cxx11::string::string<std::allocator<char>>(local_350,"a_position",&local_4c1);
  std::__cxx11::string::string((string *)&local_2f8,local_350);
  local_2f8.type = GENERICVECTYPE_FLOAT;
  pSVar3 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,&local_2f8);
  std::__cxx11::string::string<std::allocator<char>>(local_370,"a_color",&local_4c2);
  std::__cxx11::string::string((string *)&local_320,local_370);
  local_320.type = GENERICVECTYPE_FLOAT;
  pSVar3 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar3,&local_320);
  local_328.type = GENERICVECTYPE_FLOAT;
  local_328.flatshade = false;
  pSVar3 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar3,&local_328);
  local_330.type = GENERICVECTYPE_FLOAT;
  local_330.flatshade = false;
  pSVar3 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar3,&local_330);
  local_474.type = GENERICVECTYPE_FLOAT;
  pSVar3 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar3,&local_474);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d0,
             "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nin highp vec4 a_color;\nout highp vec4 v_geom_FragColor;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tgl_PointSize = 1.0;\n\tv_geom_FragColor = a_color;\n}\n"
             ,&local_4c3);
  specializeShader(&local_3b0,&local_3d0,&local_4c8);
  std::__cxx11::string::string((string *)&local_390,(string *)&local_3b0);
  pSVar3 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar3,&local_390);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_430,
             "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nin mediump vec4 v_frag_FragColor;\nvoid main (void)\n{\n\tfragColor = v_frag_FragColor;\n}\n"
             ,&local_4c4);
  specializeShader(&local_410,&local_430,&local_4c8);
  std::__cxx11::string::string((string *)&local_3f0,(string *)&local_410);
  pSVar3 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar3,&local_3f0);
  iVar6 = (int)local_4b0 + iVar2;
  local_2d0.inputType = GEOMETRYSHADERINPUTTYPE_POINTS;
  local_2d0.numOutputVertices = (size_t)iVar6;
  local_2d0.numInvocations = 1;
  local_2d0.outputType = GVar1;
  local_4a0 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar3,&local_2d0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2b8);
  std::operator<<(&local_2b8,"${GLSL_VERSION_DECL}\n");
  std::operator<<(&local_2b8,"${GLSL_EXT_GEOMETRY_SHADER}");
  std::operator<<(&local_2b8,"layout(points) in;\n");
  poVar4 = std::operator<<(&local_2b8,"layout(");
  Functional::(anonymous_namespace)::outputTypeToGLString_abi_cxx11_
            (&local_498,(_anonymous_namespace_ *)(ulong)GVar1,outputType);
  poVar4 = std::operator<<(poVar4,(string *)&local_498);
  poVar4 = std::operator<<(poVar4,", max_vertices = ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar6);
  std::operator<<(poVar4,") out;");
  std::__cxx11::string::~string((string *)&local_498);
  std::operator<<(&local_2b8,"\n");
  std::operator<<(&local_2b8,
                  "in highp vec4 v_geom_FragColor[];\nout highp vec4 v_frag_FragColor;\n\nvoid main (void)\n{\n\tconst highp vec4 position0 = vec4(-0.5,  0.5, 0.0, 0.0);\n\tconst highp vec4 position1 = vec4( 0.0,  0.1, 0.0, 0.0);\n\tconst highp vec4 position2 = vec4( 0.5,  0.5, 0.0, 0.0);\n\tconst highp vec4 position3 = vec4( 0.7, -0.2, 0.0, 0.0);\n\tconst highp vec4 position4 = vec4( 0.2,  0.2, 0.0, 0.0);\n\tconst highp vec4 position5 = vec4( 0.4, -0.3, 0.0, 0.0);\n\n"
                 );
  iVar5 = 0;
  iVar6 = 0;
  if (0 < iVar2) {
    iVar6 = iVar2;
  }
  for (; iVar6 != iVar5; iVar5 = iVar5 + 1) {
    poVar4 = std::operator<<(&local_2b8,"\tgl_Position = gl_in[0].gl_Position + position");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar5);
    std::operator<<(poVar4,
                    ";\n\tgl_PrimitiveID = gl_PrimitiveIDIn;\n\tv_frag_FragColor = v_geom_FragColor[0];\n\tEmitVertex();\n\n"
                   );
  }
  iVar6 = 0;
  if (0 < local_4bc) {
    iVar6 = local_4bc;
  }
  while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
    std::operator<<(&local_2b8,"\tEndPrimitive();\n");
  }
  iVar5 = 0;
  iVar6 = 0;
  if (0 < (int)local_4b0) {
    iVar6 = (int)local_4b0;
  }
  for (; iVar6 != iVar5; iVar5 = iVar5 + 1) {
    poVar4 = std::operator<<(&local_2b8,"\tgl_Position = gl_in[0].gl_Position + position");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2 + iVar5);
    std::operator<<(poVar4,
                    ";\n\tgl_PrimitiveID = gl_PrimitiveIDIn;\n\tv_frag_FragColor = v_geom_FragColor[0];\n\tEmitVertex();\n\n"
                   );
  }
  iVar6 = 0;
  if (0 < local_4c0) {
    iVar6 = local_4c0;
  }
  while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
    std::operator<<(&local_2b8,"\tEndPrimitive();\n");
  }
  std::operator<<(&local_2b8,"}\n");
  std::__cxx11::stringbuf::str();
  specializeShader(&local_470,&local_498,&local_4c8);
  std::__cxx11::string::~string((string *)&local_498);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2b8);
  std::__cxx11::string::string((string *)&local_450,(string *)&local_470);
  this_00 = local_4b8;
  pSVar3 = sglr::pdec::ShaderProgramDeclaration::operator<<(local_4a0,&local_450);
  sglr::ShaderProgram::ShaderProgram(&this_00->super_ShaderProgram,pSVar3);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string(local_370);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string(local_350);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_140);
  (this_00->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_01e4f8b0;
  (this_00->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_01e4f8e8;
  (this_00->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_01e4f900;
  *(int *)&(this_00->super_ShaderProgram).field_0x154 = iVar2;
  this_00->m_endCountA = local_4bc;
  this_00->m_emitCountB = (int)local_4b0;
  this_00->m_endCountB = local_4c0;
  local_4a8->m_program = this_00;
  iVar2 = GeometryShaderRenderTest::init
                    (&local_4a8->super_GeometryShaderRenderTest,(EVP_PKEY_CTX *)pSVar3);
  return iVar2;
}

Assistant:

void EmitTest::init(void)
{
	m_program = new VertexEmitterShader(m_context.getRenderContext().getType(), m_emitCountA, m_endCountA, m_emitCountB, m_endCountB, sglr::rr_util::mapGLGeometryShaderOutputType(m_outputType));

	GeometryShaderRenderTest::init();
}